

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_expr.cpp
# Opt level: O0

double __thiscall nivalis::Expr::operator()(Expr *this,double arg,Environment *env)

{
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> *in_RSI;
  iterator in_XMM0_Qa;
  double dVar1;
  vector<double,_std::allocator<double>_> *in_stack_000003d8;
  AST *in_stack_000003e0;
  Environment *in_stack_000003e8;
  allocator_type *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  undefined1 *puVar2;
  
  puVar2 = &stack0xffffffffffffffb8;
  std::allocator<double>::allocator((allocator<double> *)0x14319f);
  __l._M_len = (size_type)puVar2;
  __l._M_array = in_XMM0_Qa;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffb0,__l,in_stack_ffffffffffffffa8);
  dVar1 = detail::eval_ast(in_stack_000003e8,in_stack_000003e0,in_stack_000003d8);
  std::vector<double,_std::allocator<double>_>::~vector(in_RSI);
  std::allocator<double>::~allocator((allocator<double> *)0x1431ea);
  return dVar1;
}

Assistant:

double Expr::operator()(double arg, Environment& env) const {
    return detail::eval_ast(env, ast, {arg});
}